

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.hpp
# Opt level: O1

void __thiscall ot::commissioner::coap::OptionValue::OptionValue(OptionValue *this,uint32_t aUint32)

{
  pointer *ppuVar1;
  uchar uVar2;
  iterator __position;
  pointer puVar3;
  pointer puVar4;
  uchar *puVar5;
  pointer puVar6;
  uint uVar7;
  ulong uVar8;
  uchar local_19;
  
  (this->mValue).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mValue).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mValue).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (aUint32 != 0) {
    uVar8 = (ulong)aUint32;
    do {
      local_19 = (uchar)uVar8;
      __position._M_current =
           (this->mValue).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->mValue).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
                  (&this->mValue,__position,&local_19);
      }
      else {
        *__position._M_current = local_19;
        ppuVar1 = &(this->mValue).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppuVar1 = *ppuVar1 + 1;
      }
      uVar7 = (uint)uVar8;
      uVar8 = uVar8 >> 8;
    } while (0xff < uVar7);
  }
  puVar3 = (this->mValue).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar4 = (this->mValue).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar6 = puVar4 + -1;
  if (puVar3 < puVar6 && puVar3 != puVar4) {
    do {
      puVar5 = puVar3 + 1;
      uVar2 = *puVar3;
      *puVar3 = *puVar6;
      *puVar6 = uVar2;
      puVar6 = puVar6 + -1;
      puVar3 = puVar5;
    } while (puVar5 < puVar6);
  }
  return;
}

Assistant:

explicit OptionValue(uint32_t aUint32)
    {
        // Encoding an unsigned integer without preceding zeros.
        while (aUint32 != 0)
        {
            mValue.push_back(aUint32 & 0xff);
            aUint32 >>= 8;
        }
        std::reverse(mValue.begin(), mValue.end());
    }